

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O3

int __thiscall CommandLineTestRunner::runAllTestsMain(CommandLineTestRunner *this)

{
  TestRegistry *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  SetPointerPlugin pPlugin;
  SimpleString local_50;
  TestPlugin local_40;
  
  SimpleString::SimpleString(&local_50,"SetPointerPlugin");
  SetPointerPlugin::SetPointerPlugin((SetPointerPlugin *)&local_40,&local_50);
  SimpleString::~SimpleString(&local_50);
  (*this->registry_->_vptr_TestRegistry[0xc])(this->registry_,&local_40);
  iVar3 = (*this->registry_->_vptr_TestRegistry[0xe])();
  bVar2 = parseArguments(this,(TestPlugin *)CONCAT44(extraout_var,iVar3));
  iVar3 = 1;
  if (bVar2) {
    iVar3 = runAllTests(this);
  }
  pTVar1 = this->registry_;
  SimpleString::SimpleString(&local_50,"SetPointerPlugin");
  (*pTVar1->_vptr_TestRegistry[0x10])(pTVar1,&local_50);
  SimpleString::~SimpleString(&local_50);
  TestPlugin::~TestPlugin(&local_40);
  return iVar3;
}

Assistant:

int CommandLineTestRunner::runAllTestsMain()
{
    int testResult = 1;

    SetPointerPlugin pPlugin(DEF_PLUGIN_SET_POINTER);
    registry_->installPlugin(&pPlugin);

    if (parseArguments(registry_->getFirstPlugin()))
        testResult = runAllTests();

    registry_->removePluginByName(DEF_PLUGIN_SET_POINTER);
    return testResult;
}